

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optim_mir.cpp
# Opt level: O0

vector<int,_std::allocator<int>_> *
vectors_intersection(vector<int,_std::allocator<int>_> *v1,vector<int,_std::allocator<int>_> *v2)

{
  iterator __first1;
  iterator __last1;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __first2;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_RDX;
  back_insert_iterator<std::vector<int,_std::allocator<int>_>_> in_RSI;
  vector<int,_std::allocator<int>_> *in_RDI;
  vector<int,_std::allocator<int>_> *v;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff48;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_ffffffffffffff58;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_ffffffffffffff80;
  
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x2790b3);
  std::vector<int,_std::allocator<int>_>::begin(in_stack_ffffffffffffff48);
  std::vector<int,_std::allocator<int>_>::end(in_stack_ffffffffffffff48);
  std::sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            (in_RDX,in_stack_ffffffffffffff58);
  std::vector<int,_std::allocator<int>_>::begin(in_stack_ffffffffffffff48);
  std::vector<int,_std::allocator<int>_>::end(in_stack_ffffffffffffff48);
  std::sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            (in_RDX,in_stack_ffffffffffffff58);
  std::vector<int,_std::allocator<int>_>::begin(in_stack_ffffffffffffff48);
  std::vector<int,_std::allocator<int>_>::end(in_stack_ffffffffffffff48);
  __first1 = std::vector<int,_std::allocator<int>_>::begin(in_stack_ffffffffffffff48);
  __last1 = std::vector<int,_std::allocator<int>_>::end(in_stack_ffffffffffffff48);
  __first2._M_current =
       (int *)std::back_inserter<std::vector<int,std::allocator<int>>>(in_stack_ffffffffffffff48);
  std::
  set_intersection<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::back_insert_iterator<std::vector<int,std::allocator<int>>>>
            ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)__first1._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)__last1._M_current,
             __first2,in_stack_ffffffffffffff80,in_RSI);
  return in_RDI;
}

Assistant:

vector<int> vectors_intersection(vector<int> v1, vector<int> v2) {
  vector<int> v;
  sort(v1.begin(), v1.end());
  sort(v2.begin(), v2.end());
  set_intersection(v1.begin(), v1.end(), v2.begin(), v2.end(),
                   back_inserter(v));
  return v;
}